

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_getmountpoint(char *args)

{
  size_t sVar1;
  undefined8 uVar2;
  char *local_10;
  char *args_local;
  
  local_10 = args;
  if (*args == '\"') {
    local_10 = args + 1;
    sVar1 = strlen(local_10);
    local_10[sVar1 - 1] = '\0';
  }
  uVar2 = PHYSFS_getMountPoint(local_10);
  printf("Dir [%s] is mounted at [%s].\n",local_10,uVar2);
  return 1;
}

Assistant:

static int cmd_getmountpoint(char *args)
{
    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    printf("Dir [%s] is mounted at [%s].\n", args, PHYSFS_getMountPoint(args));
    return 1;
}